

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

void __thiscall
TestChain100Setup::MockMempoolMinFee(TestChain100Setup *this,CFeeRate *target_feerate)

{
  CTxMemPool *pCVar1;
  undefined1 auVar2 [24];
  unsigned_long uVar3;
  int64_t iVar4;
  CAmount CVar5;
  CAmount CVar6;
  CFeeRate CVar7;
  long in_FS_OFFSET;
  Span<std::byte> output;
  CMutableTransaction mtx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CTransactionRef tx;
  uint256 ret;
  long local_210;
  undefined1 local_208 [63];
  uchar local_1c9;
  unique_lock<std::recursive_mutex> local_1c8;
  unique_lock<std::recursive_mutex> local_1b8;
  undefined1 local_1a8 [64];
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_168 [4];
  undefined1 local_98 [28];
  uint uStack_7c;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  uchar local_68 [8];
  uchar auStack_60 [8];
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b8._M_device = &cs_main.super_recursive_mutex;
  local_1b8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_1b8);
  local_1c8._M_device =
       &(((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool.
          _M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs).super_recursive_mutex;
  local_1c8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_1c8);
  uVar3 = CTxMemPool::size((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  if (uVar3 != 0) {
    __assert_fail("m_node.mempool->size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x22b,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (target_feerate->nSatoshisPerK <= (pCVar1->m_opts).incremental_relay_feerate.nSatoshisPerK) {
    __assert_fail("target_feerate > m_node.mempool->m_opts.incremental_relay_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x22e,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  if (target_feerate->nSatoshisPerK <= (pCVar1->m_opts).min_relay_feerate.nSatoshisPerK) {
    __assert_fail("target_feerate > m_node.mempool->m_opts.min_relay_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x230,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_208);
  local_58._16_4_ = 0;
  local_58._20_4_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  output.m_size = 0x20;
  output.m_data = local_58;
  FastRandomContext::fillrand
            (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng,
             output);
  local_1a8._4_4_ = local_58._4_4_;
  local_1a8._0_4_ = local_58._0_4_;
  local_1a8._12_4_ = local_58._12_4_;
  local_1a8._8_4_ = local_58._8_4_;
  local_1a8._20_4_ = local_58._20_4_;
  local_1a8._16_4_ = local_58._16_4_;
  local_1a8._24_8_ = stack0xffffffffffffffc0;
  local_1a8._32_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_208,(COutPoint *)local_1a8);
  local_210 = 100000000;
  local_98._16_8_ = 0;
  stack0xffffffffffffff80 = 0;
  local_98._0_8_ = (char *)0x0;
  local_98._8_8_ = 0;
  local_1c9 = 'Q';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_98,(iterator)local_98,
             &local_1c9);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)local_78,(CScript *)local_98);
  local_1a8[0x10] = local_68[0];
  local_1a8[0x11] = local_68[1];
  local_1a8[0x12] = local_68[2];
  local_1a8[0x13] = local_68[3];
  local_1a8[0x14] = local_68[4];
  local_1a8[0x15] = local_68[5];
  local_1a8[0x16] = local_68[6];
  local_1a8[0x17] = local_68[7];
  local_1a8[0x18] = auStack_60[0];
  local_1a8[0x19] = auStack_60[1];
  local_1a8[0x1a] = auStack_60[2];
  local_1a8[0x1b] = auStack_60[3];
  local_1a8[0x1c] = auStack_60[4];
  local_1a8[0x1d] = auStack_60[5];
  local_1a8[0x1e] = auStack_60[6];
  local_1a8[0x1f] = auStack_60[7];
  local_1a8._0_8_ = local_78;
  local_1a8._8_8_ = _Stack_70._M_pi;
  local_168[0]._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 4;
  GetScriptForDestination((CScript *)local_58,(CTxDestination *)local_1a8);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)(local_208 + 0x18),&local_210,
             (CScript *)local_58);
  if (0x1c < uStack_3c) {
    free((void *)CONCAT44(local_58._4_4_,local_58._0_4_));
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_1a8);
  if (0x1c < uStack_7c) {
    free((void *)local_98._0_8_);
  }
  local_78 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&_Stack_70,(CTransaction **)local_78,(allocator<CTransaction> *)local_1a8,
             (CMutableTransaction *)local_208);
  local_58._4_4_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_4_ = 0;
  iVar4 = GetVirtualTransactionSize((CTransaction *)local_78,0,0);
  CVar5 = CFeeRate::GetFee(target_feerate,(uint32_t)iVar4);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  iVar4 = GetVirtualTransactionSize((CTransaction *)local_78,0,0);
  CVar6 = CFeeRate::GetFee(&(pCVar1->m_opts).incremental_relay_feerate,(uint32_t)iVar4);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  auVar2._16_4_ = local_58._16_4_;
  auVar2._12_4_ = local_58._12_4_;
  auVar2._8_4_ = local_58._8_4_;
  auVar2._4_4_ = local_58._4_4_;
  auVar2._0_4_ = local_58._0_4_;
  auVar2._20_4_ = 0;
  CTxMemPoolEntry::CTxMemPoolEntry
            ((CTxMemPoolEntry *)local_1a8,(CTransactionRef *)local_78,CVar5 - CVar6,0,1,0,true,1,
             (LockPoints)(auVar2 << 0x20));
  CTxMemPool::addUnchecked(pCVar1,(CTxMemPoolEntry *)local_1a8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_1a8 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  CTxMemPool::TrimToSize
            ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
             mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,0,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CVar7 = CTxMemPool::GetMinFee(pCVar1,(pCVar1->m_opts).max_size_bytes);
  if (CVar7.nSatoshisPerK == target_feerate->nSatoshisPerK) {
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_208 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_208);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_1c8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_1b8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_node.mempool->GetMinFee() == target_feerate",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                ,0x240,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
}

Assistant:

void TestChain100Setup::MockMempoolMinFee(const CFeeRate& target_feerate)
{
    LOCK2(cs_main, m_node.mempool->cs);
    // Transactions in the mempool will affect the new minimum feerate.
    assert(m_node.mempool->size() == 0);
    // The target feerate cannot be too low...
    // ...otherwise the transaction's feerate will need to be negative.
    assert(target_feerate > m_node.mempool->m_opts.incremental_relay_feerate);
    // ...otherwise this is not meaningful. The feerate policy uses the maximum of both feerates.
    assert(target_feerate > m_node.mempool->m_opts.min_relay_feerate);

    // Manually create an invalid transaction. Manually set the fee in the CTxMemPoolEntry to
    // achieve the exact target feerate.
    CMutableTransaction mtx = CMutableTransaction();
    mtx.vin.emplace_back(COutPoint{Txid::FromUint256(m_rng.rand256()), 0});
    mtx.vout.emplace_back(1 * COIN, GetScriptForDestination(WitnessV0ScriptHash(CScript() << OP_TRUE)));
    const auto tx{MakeTransactionRef(mtx)};
    LockPoints lp;
    // The new mempool min feerate is equal to the removed package's feerate + incremental feerate.
    const auto tx_fee = target_feerate.GetFee(GetVirtualTransactionSize(*tx)) -
        m_node.mempool->m_opts.incremental_relay_feerate.GetFee(GetVirtualTransactionSize(*tx));
    m_node.mempool->addUnchecked(CTxMemPoolEntry(tx, /*fee=*/tx_fee,
                                                 /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                 /*spends_coinbase=*/true, /*sigops_cost=*/1, lp));
    m_node.mempool->TrimToSize(0);
    assert(m_node.mempool->GetMinFee() == target_feerate);
}